

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boardtest.h
# Opt level: O0

void __thiscall test::BoardTest::SetUp(BoardTest *this)

{
  char *__s;
  allocator<char> local_31;
  string local_30;
  BoardTest *local_10;
  BoardTest *this_local;
  
  local_10 = this;
  UnitTest::SetUp(&this->super_UnitTest);
  board::Board::INIT();
  __s = board::Board::DEFAULT_FEN;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
  board::Board::parseFen(&this->pos,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

virtual void SetUp()
    {
        UnitTest::SetUp();

        board::Board::INIT();
        pos.parseFen(board::Board::DEFAULT_FEN);
    }